

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

bool MallocBlock::CheckEverything(void)

{
  AllocMap *this;
  anon_class_1_0_00000001 local_19;
  FunctionRef<void_(const_void_*,_int_*)> local_18;
  
  SpinLock::Lock(&alloc_map_lock_);
  this = alloc_map_;
  if (alloc_map_ != (AllocMap *)0x0) {
    tcmalloc::FunctionRef<void(void_const*,int*)>::
    FunctionRef<MallocBlock::CheckEverything()::_lambda(void_const*,int*)_1_,void>
              ((FunctionRef<void(void_const*,int*)> *)&local_18,&local_19);
    AddressMap<int>::Iterate(this,local_18);
  }
  SpinLock::Unlock(&alloc_map_lock_);
  return true;
}

Assistant:

static bool CheckEverything() {
    alloc_map_lock_.Lock();
    if (alloc_map_) {
      alloc_map_->Iterate([] (const void* ptr, int* type) {
        if ((*type & kDeallocatedTypeBit) == 0) {
          FromRawPointer(ptr)->CheckLocked(*type);
        }
      });
    }
    alloc_map_lock_.Unlock();
    return true;  // if we get here, we're okay
  }